

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O0

HalfedgeHandle __thiscall
OpenMesh::TriConnectivity::vertex_split
          (TriConnectivity *this,VertexHandle v0,VertexHandle v1,VertexHandle vl,VertexHandle vr)

{
  bool bVar1;
  HalfedgeHandle HVar2;
  BaseHandle BVar3;
  BaseHandle local_34;
  BaseHandle local_30;
  HalfedgeHandle vrv1;
  HalfedgeHandle vlv1;
  HalfedgeHandle v1vl;
  TriConnectivity *this_local;
  BaseHandle local_18;
  VertexHandle vr_local;
  VertexHandle vl_local;
  VertexHandle v1_local;
  VertexHandle v0_local;
  HalfedgeHandle v0v1;
  
  this_local._4_4_ = vr.super_BaseHandle.idx_;
  local_18 = vl.super_BaseHandle.idx_;
  vr_local = v1;
  HalfedgeHandle::HalfedgeHandle(&vrv1,-1);
  HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_30,-1);
  HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_34,-1);
  HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&v1_local,-1);
  bVar1 = BaseHandle::is_valid(&local_18);
  if (bVar1) {
    vrv1 = PolyConnectivity::find_halfedge
                     (&this->super_PolyConnectivity,vr_local,(VertexHandle)local_18.idx_);
    bVar1 = BaseHandle::is_valid(&vrv1.super_BaseHandle);
    if (!bVar1) {
      __assert_fail("v1vl.is_valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/TriConnectivity.cc"
                    ,0xbb,
                    "TriConnectivity::HalfedgeHandle OpenMesh::TriConnectivity::vertex_split(VertexHandle, VertexHandle, VertexHandle, VertexHandle)"
                   );
    }
    local_30.idx_ = (int)insert_loop(this,vrv1);
  }
  bVar1 = BaseHandle::is_valid((BaseHandle *)((long)&this_local + 4));
  if (bVar1) {
    local_34.idx_ =
         (int)PolyConnectivity::find_halfedge
                        (&this->super_PolyConnectivity,this_local._4_4_,vr_local);
    bVar1 = BaseHandle::is_valid(&local_34);
    if (!bVar1) {
      __assert_fail("vrv1.is_valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/TriConnectivity.cc"
                    ,0xc3,
                    "TriConnectivity::HalfedgeHandle OpenMesh::TriConnectivity::vertex_split(VertexHandle, VertexHandle, VertexHandle, VertexHandle)"
                   );
    }
    insert_loop(this,(HalfedgeHandle)local_34.idx_);
  }
  bVar1 = BaseHandle::is_valid(&local_18);
  if (!bVar1) {
    HVar2 = ArrayKernel::halfedge_handle((ArrayKernel *)this,vr_local);
    local_30.idx_ = (int)ArrayKernel::prev_halfedge_handle((ArrayKernel *)this,HVar2);
  }
  bVar1 = BaseHandle::is_valid((BaseHandle *)((long)&this_local + 4));
  if (!bVar1) {
    HVar2 = ArrayKernel::halfedge_handle((ArrayKernel *)this,vr_local);
    local_34.idx_ = (int)ArrayKernel::prev_halfedge_handle((ArrayKernel *)this,HVar2);
  }
  BVar3.idx_ = (int)insert_edge(this,v0,local_30.idx_,local_34.idx_);
  return (BaseHandle)(BaseHandle)BVar3.idx_;
}

Assistant:

TriConnectivity::HalfedgeHandle
TriConnectivity::vertex_split(VertexHandle v0, VertexHandle v1,
                              VertexHandle vl, VertexHandle vr)
{
  HalfedgeHandle v1vl, vlv1, vrv1, v0v1;

  // build loop from halfedge v1->vl
  if (vl.is_valid())
  {
    v1vl = find_halfedge(v1, vl);
    assert(v1vl.is_valid());
    vlv1 = insert_loop(v1vl);
  }

  // build loop from halfedge vr->v1
  if (vr.is_valid())
  {
    vrv1 = find_halfedge(vr, v1);
    assert(vrv1.is_valid());
    insert_loop(vrv1);
  }

  // handle boundary cases
  if (!vl.is_valid())
    vlv1 = prev_halfedge_handle(halfedge_handle(v1));
  if (!vr.is_valid())
    vrv1 = prev_halfedge_handle(halfedge_handle(v1));


  // split vertex v1 into edge v0v1
  v0v1 = insert_edge(v0, vlv1, vrv1);


  return v0v1;
}